

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O1

DeepTiledInputFile * __thiscall
Imf_3_4::MultiPartInputFile::getInputPart<Imf_3_4::DeepTiledInputFile>
          (MultiPartInputFile *this,int partNumber)

{
  pthread_mutex_t *__mutex;
  element_type *peVar1;
  pointer pPVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar6;
  undefined8 *puVar7;
  DeepTiledInputFile *this_01;
  ostream *poVar8;
  ArgExc *this_02;
  DeepTiledInputFile *__tmp;
  ulong uVar9;
  bool bVar10;
  file_storage f;
  __shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  ostream local_1a8 [376];
  
  uVar4 = (ulong)(uint)partNumber;
  if ((-1 < partNumber) &&
     (__mutex = (pthread_mutex_t *)
                (this->_data).
                super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr,
     uVar9 = (*(long *)((long)__mutex + 0x30) - __mutex[1].__align >> 5) * -0x5555555555555555,
     uVar4 <= uVar9 && uVar9 - uVar4 != 0)) {
    iVar6 = pthread_mutex_lock(__mutex);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    local_1b8._M_ptr = (DeepTiledInputFile *)0x0;
    local_1b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pPVar2 = (peVar1->parts).
             super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((any *)((long)(pPVar2 + uVar4) + 0x50))->_M_manager ==
        (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      this_01 = (DeepTiledInputFile *)operator_new(0x20);
      DeepTiledInputFile::DeepTiledInputFile
                (this_01,&(peVar1->parts).
                          super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].data);
      std::__shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>::
      reset<Imf_3_4::DeepTiledInputFile>(&local_1b8,this_01);
      std::any::operator=((any *)((long)((((this->_data).
                                           super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->parts).
                                         super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar4) + 0x50),
                          (shared_ptr<Imf_3_4::DeepTiledInputFile> *)&local_1b8);
    }
    else {
      puVar7 = (undefined8 *)
               std::__any_caster<std::shared_ptr<Imf_3_4::DeepTiledInputFile>>
                         ((any *)((long)(pPVar2 + uVar4) + 0x50));
      this_00._M_pi = local_1b8._M_refcount._M_pi;
      if (puVar7 == (undefined8 *)0x0) {
        std::__throw_bad_any_cast();
      }
      local_1b8._M_ptr = (element_type *)*puVar7;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar7[1];
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      bVar10 = local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1b8._M_refcount._M_pi = p_Var3;
      if (bVar10) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
    }
    peVar5 = local_1b8._M_ptr;
    if (local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_refcount._M_pi);
    }
    pthread_mutex_unlock(__mutex);
    return peVar5;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"MultiPartInputFile::getPart called with invalid part ",0x35);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,partNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," on file with ",0xe);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," parts",6);
  this_02 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_02,(stringstream *)&local_1b8);
  __cxa_throw(this_02,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

T*
MultiPartInputFile::getInputPart (int partNumber)
{
    if (partNumber < 0 || static_cast<size_t> (partNumber) >= _data->parts.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartInputFile::getPart called with invalid part "
                << partNumber << " on file with " << _data->parts.size () << " parts");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    using file_storage = std::shared_ptr<T>;
    file_storage f;
    if (!_data->parts[partNumber].file.has_value ())
    {
        // TODO: change to copy / value semantics
        // stupid make_shared and friend functions, can we remove this restriction?
        // f = std::make_shared<T> (&(_data->parts[partNumber].data));
        f.reset (new T (&(_data->parts[partNumber].data)));
        _data->parts[partNumber].file = f;
    }
    else
        f = std::any_cast<file_storage> (_data->parts[partNumber].file);

    // TODO: change to by reference / value semantics
    return f.get();
}